

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

void __thiscall
iaf_psc_alpha::iaf_psc_alpha
          (iaf_psc_alpha *this,long n_populationID,int n_neuronID,iaf_psc_alpha_param *param)

{
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  Neuron *in_RDI;
  Neuron *in_stack_ffffffffffffffd0;
  
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_0018fc20;
  *(undefined1 *)&in_RDI[1]._vptr_Neuron = 1;
  *(undefined8 *)&in_RDI[1].neuronID = in_RCX;
  in_RDI[2]._vptr_Neuron = (_func_int **)0x0;
  in_RDI[2].populationID = 0;
  *(undefined8 *)&in_RDI[2].neuronID = 0;
  in_RDI[2].logger = (Logging *)0x0;
  in_RDI[3]._vptr_Neuron = (_func_int **)0x0;
  in_RDI[3].populationID = 0;
  in_RDI[3].neuronID = 0;
  in_RDI[8].populationID = 0;
  *(undefined8 *)&in_RDI[8].neuronID = 0;
  in_RDI->populationID = in_RSI;
  in_RDI->neuronID = in_EDX;
  Neuron::initialize(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

iaf_psc_alpha::iaf_psc_alpha(long n_populationID, int n_neuronID, iaf_psc_alpha_param* param) : param(param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    initialize();
}